

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::session_impl::dht_put_immutable_item
          (session_impl *this,entry *data,sha1_hash target)

{
  dht_tracker *this_00;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  this_00 = (this->m_dht).
            super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (dht_tracker *)0x0) {
    local_48._8_8_ = 0;
    local_48._M_unused._M_object = operator_new(0x28);
    *(code **)local_48._M_unused._0_8_ = anon_unknown_119::on_dht_put_immutable_item;
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = target.m_number._M_elems._0_8_;
    *(undefined8 *)((long)local_48._M_unused._0_8_ + 0x10) = target.m_number._M_elems._8_8_;
    *(uint *)((long)local_48._M_unused._0_8_ + 0x18) = target.m_number._M_elems[4];
    *(alert_manager **)((long)local_48._M_unused._0_8_ + 0x20) = &this->m_alerts;
    local_30 = ::std::
               _Function_handler<void_(int),_std::_Bind<void_(*(std::reference_wrapper<libtorrent::aux::alert_manager>,_libtorrent::digest32<160L>,_std::_Placeholder<1>))(libtorrent::aux::alert_manager_&,_libtorrent::digest32<160L>,_int)>_>
               ::_M_invoke;
    local_38 = ::std::
               _Function_handler<void_(int),_std::_Bind<void_(*(std::reference_wrapper<libtorrent::aux::alert_manager>,_libtorrent::digest32<160L>,_std::_Placeholder<1>))(libtorrent::aux::alert_manager_&,_libtorrent::digest32<160L>,_int)>_>
               ::_M_manager;
    libtorrent::dht::dht_tracker::put_item(this_00,data,(function<void_(int)> *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
  }
  return;
}

Assistant:

ip_filter const& session_impl::get_peer_class_filter() const
	{
		return m_peer_class_filter;
	}